

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_term.h
# Opt level: O0

LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
* viras::
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::analyse(Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
            self,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                 x)

{
  anon_class_24_3_77a33212 matchRec_00;
  anon_class_24_3_77a33212 matchRec_01;
  anon_class_24_3_77a33212 matchRec_02;
  anon_class_24_3_77a33212 matchRec_03;
  anon_class_24_3_77a33212 matchRec_04;
  anon_class_24_3_77a33212 matchRec_05;
  anon_class_24_3_77a33212 matchRec_06;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *in_RCX;
  pointer in_RDX;
  pointer in_RSI;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_RDI;
  uint64_t in_R8;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  WVar1;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  WVar2;
  anon_class_24_3_77a33212 matchRec;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  rec1;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  rec0;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *res;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *pNVar3;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *pLVar4;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *this;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *__x;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *in_stack_fffffffffffffb90;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffb98;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffba0;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffba8;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffbb0;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *pLVar5;
  undefined8 in_stack_fffffffffffffbc8;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffbd0;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffbd8;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_fffffffffffffc00;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_218;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  local_120 [6];
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *local_28;
  uint64_t uStack_20;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  local_18;
  
  pLVar5 = in_RDI;
  local_28 = in_RCX;
  uStack_20 = in_R8;
  local_18.
  super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_RSI;
  local_18.
  super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_RDX;
  LiraTerm(in_stack_fffffffffffffbb0);
  LiraTerm(in_stack_fffffffffffffbb0);
  matchTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>,viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1)_1_,viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda()_1_,viras::LiraTerm<viras::Con___eVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>____lambda_auto_1__2_>
            (local_18.
             super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_18.
             super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,local_120,&local_28,local_120,&local_28,
             local_120,&local_28,&local_218);
  this = &local_218;
  __x = &local_18;
  LiraTerm(in_stack_fffffffffffffbb0);
  (in_RDI->self).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = (Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             *)local_18.
               super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (in_RDI->self).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content =
       (uint64_t)
       local_18.
       super__Vector_base<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (in_RDI->x).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .config = local_28;
  (in_RDI->x).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = uStack_20;
  matchRec_00.rec1 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbc8;
  matchRec_00.rec0 = pLVar5;
  matchRec_00.self =
       (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbd0;
  pNVar3 = local_120;
  pLVar4 = this;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcPer<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            (in_stack_fffffffffffffba8,
             (Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
              *)in_stack_fffffffffffffba0,matchRec_00);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::operator=((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
               *)pLVar4,pNVar3);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)0x6e6cff);
  matchRec_01.rec1 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbc8;
  matchRec_01.rec0 = pLVar5;
  matchRec_01.self =
       (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbd0;
  WVar1 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            ::
            calcLim<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
                      (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,matchRec_01);
  (in_RDI->lim).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       = WVar1;
  matchRec_04.rec1 = in_stack_fffffffffffffbd8;
  matchRec_04.rec0 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbd0;
  matchRec_04.self = in_stack_fffffffffffffbe0;
  pNVar3 = local_120;
  pLVar4 = this;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcSslp<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            (in_RDI,(Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                     *)WVar1.config,matchRec_04);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::operator=((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
               *)pLVar4,pNVar3);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)0x6e6df8);
  matchRec_02.rec1 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbc8;
  matchRec_02.rec0 = pLVar5;
  matchRec_02.self =
       (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbd0;
  pNVar3 = local_120;
  pLVar4 = this;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcOslp<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            ((LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)WVar1.inner._content._content,
             (Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
              *)in_stack_fffffffffffffba0,matchRec_02);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::operator=((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
               *)pLVar4,pNVar3);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)0x6e6e73);
  matchRec_06.rec1 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbf8;
  matchRec_06.rec0 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbf0;
  matchRec_06.self = in_stack_fffffffffffffc00;
  pNVar3 = local_120;
  pLVar4 = this;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcDeltaY<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,matchRec_06);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::operator=((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
               *)pLVar4,pNVar3);
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)0x6e6ef1);
  matchRec_05.rec1 = in_stack_fffffffffffffbd8;
  matchRec_05.rec0 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)in_stack_fffffffffffffbd0;
  matchRec_05.self = in_stack_fffffffffffffbe0;
  WVar2 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
            ::
            calcDistYminus<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
                      ((LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
                        *)WVar1.config,
                       (Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                        *)WVar1.inner._content._content,matchRec_05);
  (in_RDI->distYminus).
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       = WVar2;
  matchRec_03.rec1 =
       (LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
        *)local_120;
  matchRec_03.rec0 = pLVar5;
  matchRec_03.self = &this->self;
  LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
  ::
  calcBreaks<viras::LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>::analyse(viras::Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>,viras::Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>)::_lambda(auto:1,auto:2,auto:3,auto:4,auto:5)_1_>
            ((LiraTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
              *)WVar1.inner._content._content,
             (Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
              *)WVar2.config,matchRec_03);
  std::
  vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::operator=(in_stack_fffffffffffffb90,__x);
  std::
  vector<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::Break<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~vector(in_stack_fffffffffffffb90);
  DefaultOpts::optimizeBounds();
  ~LiraTerm(this);
  ~LiraTerm(this);
  return pLVar5;
}

Assistant:

static LiraTerm analyse(Term<C> self, Var<C> x) {
      LiraTerm rec0;
      LiraTerm rec1;
      matchTerm(self, 
        /* var v */ [&](auto y) { return std::make_tuple(); }, 
        /* numeral 1 */ [&]() { return std::make_tuple(); }, 
        /* k * t */ [&](auto k, auto t) { 
          rec0 = analyse(t, x);
          return std::make_tuple();
        }, 

        /* l + r */ [&](auto l, auto r) { 
          rec0 = analyse(l, x);
          rec1 = analyse(r, x);
          return std::make_tuple();
        }, 

        /* floor */ [&](auto t) { 
          rec0 = analyse(t, x);
          return std::make_tuple();
        });
      auto matchRec = [&](auto if_var, auto if_one, auto if_mul, auto if_add, auto if_floor) {
        return matchTerm(self, 
        /* var v */ if_var,
        /* numeral 1 */ if_one,
        /* k * t */ [&](auto k, auto t) { return if_mul(k, t, rec0); }, 
        /* l + r */ [&](auto l, auto r) { return if_add(l, r, rec0, rec1); }, 
        /* floor */ [&](auto t) { return if_floor(t, rec0); });
      };
      LiraTerm res;
      res.self = self;
      res.x = x;
      res.per = calcPer(res, x, matchRec);
      res.lim = calcLim(res, x, matchRec);
      res.sslp = calcSslp(res, x, matchRec);
      res.oslp = calcOslp(res, x, matchRec);
      res.deltaY = calcDeltaY(res, x, matchRec);
      res.distYminus = calcDistYminus(res, x, matchRec);
      res.breaks = calcBreaks(res, x, matchRec);
      
#define DEBUG_FIELD(lvl, field)                                                                \
        VIRAS_LOG(lvl, "analyse(", res.self, ")." #field " = ", res.field)
        // DEBUG_FIELD(breaks.size())
        // iter::array(res.breaks) | iter::dbg("break") | iter::foreach([](auto...){});
        // DEBUG_FIELD(per)
        // DEBUG_FIELD(deltaY)

        if (x.config->opts.optimizeBounds()) {
          VIRAS_ASSERT(res.per != 0 || res.deltaY == 0);
        }
        VIRAS_ASSERT((res.per == 0) == (res.breaks.size() == 0));
        return res;
    }